

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::do_actual_learning<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  label_t lVar1;
  cb_class *pcVar2;
  size_t sVar3;
  cb_class *pcVar4;
  example *peVar5;
  ostream *poVar6;
  vw_exception *this;
  cb_class cVar7;
  string local_1d0;
  stringstream __msg;
  ostream local_1a0;
  
  peVar5 = test_adf_sequence(ec_seq);
  cVar7 = CB_ADF::get_observed_cost(ec_seq);
  (data->gen_cs).known_cost.cost = (float)(int)cVar7._0_8_;
  (data->gen_cs).known_cost.action = (int)((ulong)cVar7._0_8_ >> 0x20);
  (data->gen_cs).known_cost.probability = (float)(int)cVar7._8_8_;
  (data->gen_cs).known_cost.partial_prediction = (float)(int)((ulong)cVar7._8_8_ >> 0x20);
  if (peVar5 != (example *)0x0) {
    lVar1 = (peVar5->l).multi;
    pcVar2 = (cb_class *)(peVar5->l).cs.costs._end;
    sVar3 = (peVar5->l).cs.costs.erase_count;
    (data->action_label).costs.end_array = (cb_class *)(peVar5->l).cs.costs.end_array;
    (data->action_label).costs.erase_count = sVar3;
    (data->action_label).costs._begin = (cb_class *)lVar1;
    (data->action_label).costs._end = pcVar2;
    pcVar2 = (data->empty_label).costs._end;
    pcVar4 = (data->empty_label).costs.end_array;
    sVar3 = (data->empty_label).costs.erase_count;
    (peVar5->l).multi = (label_t)(data->empty_label).costs._begin;
    (peVar5->l).cs.costs._end = (wclass *)pcVar2;
    (peVar5->l).cs.costs.end_array = (wclass *)pcVar4;
    (peVar5->l).cs.costs.erase_count = sVar3;
  }
  switch(data->explore_type) {
  case 0:
    predict_or_learn_first<false>(data,base,ec_seq);
    break;
  case 1:
    predict_or_learn_greedy<false>(data,base,ec_seq);
    break;
  case 2:
    predict_or_learn_bag<false>(data,base,ec_seq);
    break;
  case 3:
    predict_or_learn_softmax<false>(data,base,ec_seq);
    break;
  case 4:
    predict_or_learn_cover<false>(data,base,ec_seq);
    break;
  case 5:
    predict_or_learn_regcb<false>(data,base,ec_seq);
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar6 = std::operator<<(&local_1a0,
                             "Unknown explorer type specified for contextual bandit learning: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_explore_adf.cc"
               ,0x2a8,&local_1d0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (peVar5 != (example *)0x0) {
    lVar1 = (label_t)(data->action_label).costs._begin;
    pcVar2 = (data->action_label).costs._end;
    sVar3 = (data->action_label).costs.erase_count;
    (peVar5->l).cs.costs.end_array = (wclass *)(data->action_label).costs.end_array;
    (peVar5->l).cs.costs.erase_count = sVar3;
    (peVar5->l).multi = lVar1;
    (peVar5->l).cs.costs._end = (wclass *)pcVar2;
  }
  return;
}

Assistant:

void do_actual_learning(cb_explore_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = test_adf_sequence(ec_seq);
  data.gen_cs.known_cost = CB_ADF::get_observed_cost(ec_seq);

  if (label_example == nullptr || !is_learn)
  {
    if (label_example != nullptr)  // extract label
    {
      data.action_label = label_example->l.cb;
      label_example->l.cb = data.empty_label;
    }
    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<false>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<false>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<false>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<false>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<false>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<false>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }
    if (label_example != nullptr)  // restore label
      label_example->l.cb = data.action_label;
  }
  else
  {
    /*	v_array<float> temp_probs;
    temp_probs = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_probs.push_back(data.ec_seq[0]->pred.a_s[i].score);*/

    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<is_learn>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<is_learn>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<is_learn>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<is_learn>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<is_learn>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<is_learn>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }

    /*	for (size_t i = 0; i < temp_probs.size(); i++)
      if (temp_probs[i] != data.ec_seq[0]->pred.a_s[i].score)
        cout << "problem! " << temp_probs[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
      data.ec_seq[0]->pred.a_s[i].action << endl; temp_probs.delete_v();*/
  }
}